

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutf8lib.c
# Opt level: O3

int codepoint(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  lua_Integer def;
  lua_Integer lVar3;
  char *o;
  size_t len;
  int code;
  ulong local_38;
  int local_2c;
  
  pcVar2 = luaL_checklstring(L,1,&local_38);
  def = luaL_optinteger(L,2,1);
  if (def < 0) {
    if (local_38 < (ulong)-def) {
      def = 0;
    }
    else {
      def = def + local_38 + 1;
    }
  }
  lVar3 = luaL_optinteger(L,3,def);
  if (lVar3 < 0) {
    if (local_38 < (ulong)-lVar3) {
      lVar3 = 0;
    }
    else {
      lVar3 = lVar3 + local_38 + 1;
    }
  }
  if (def < 1) {
    luaL_argerror(L,2,"out of range");
  }
  if ((long)local_38 < lVar3) {
    luaL_argerror(L,3,"out of range");
  }
  iVar1 = 0;
  if (def <= lVar3) {
    if (lVar3 - def < 0x7fffffff) {
      luaL_checkstack(L,(int)(lVar3 - def) + 1,"string slice too long");
      o = pcVar2 + def + -1;
      iVar1 = 0;
      if (o < pcVar2 + lVar3) {
        iVar1 = 0;
        do {
          o = utf8_decode(o,&local_2c);
          if (o == (char *)0x0) {
            pcVar2 = "invalid UTF-8 code";
            goto LAB_0012e518;
          }
          lua_pushinteger(L,(long)local_2c);
          iVar1 = iVar1 + 1;
        } while (o < pcVar2 + lVar3);
      }
    }
    else {
      pcVar2 = "string slice too long";
LAB_0012e518:
      iVar1 = luaL_error(L,pcVar2);
    }
  }
  return iVar1;
}

Assistant:

static int codepoint (lua_State *L) {
  size_t len;
  const char *s = luaL_checklstring(L, 1, &len);
  lua_Integer posi = u_posrelat(luaL_optinteger(L, 2, 1), len);
  lua_Integer pose = u_posrelat(luaL_optinteger(L, 3, posi), len);
  int lax = lua_toboolean(L, 4);
  int n;
  const char *se;
  luaL_argcheck(L, posi >= 1, 2, "out of bounds");
  luaL_argcheck(L, pose <= (lua_Integer)len, 3, "out of bounds");
  if (posi > pose) return 0;  /* empty interval; return no values */
  if (pose - posi >= INT_MAX)  /* (lua_Integer -> int) overflow? */
    return luaL_error(L, "string slice too long");
  n = (int)(pose -  posi) + 1;  /* upper bound for number of returns */
  luaL_checkstack(L, n, "string slice too long");
  n = 0;  /* count the number of returns */
  se = s + pose;  /* string end */
  for (s += posi - 1; s < se;) {
    utfint code;
    s = utf8_decode(s, &code, !lax);
    if (s == NULL)
      return luaL_error(L, "invalid UTF-8 code");
    lua_pushinteger(L, code);
    n++;
  }
  return n;
}